

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O0

string * __thiscall sqlite::Connection::Stmt::get_col<std::__cxx11::string>(Stmt *this,int column)

{
  char *pcVar1;
  undefined4 in_EDX;
  undefined8 *in_RSI;
  string *in_RDI;
  char *str;
  allocator local_21;
  undefined4 in_stack_ffffffffffffffe8;
  
  pcVar1 = (char *)sqlite3_column_text(*in_RSI,in_EDX);
  if (pcVar1 == (char *)0x0) {
    s_abi_cxx11_((char *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),0);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,pcVar1,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return in_RDI;
}

Assistant:

std::string Connection::Stmt::get_col<std::string>(const int column)
    {
        const char * str = reinterpret_cast<const char *>(sqlite3_column_text(stmt_, column));

        if(!str)
            return ""s; // empty str for NULL data
        else
            return std::string(str);
    }